

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  StkId pTVar1;
  size_t len;
  char *fmt;
  lua_State *L;
  
  if (i < ms->level) {
    len = ms->capture[i].len;
    L = ms->L;
    if (len == 0xfffffffffffffffe) {
      pTVar1 = L->top;
      (pTVar1->value).n = (double)(long)(ms->capture[i].init + (1 - (long)ms->src_init));
      pTVar1->tt = 3;
      L->top = L->top + 1;
      return;
    }
    if (len == 0xffffffffffffffff) {
      fmt = "unfinished capture";
LAB_00113fc9:
      luaL_error(L,fmt);
    }
    s = ms->capture[i].init;
  }
  else {
    L = ms->L;
    if (i != 0) {
      fmt = "invalid capture index";
      goto LAB_00113fc9;
    }
    len = (long)e - (long)s;
  }
  lua_pushlstring(L,s,len);
  return;
}

Assistant:

static void push_onecapture(MatchState*ms,int i,const char*s,
const char*e){
if(i>=ms->level){
if(i==0)
lua_pushlstring(ms->L,s,e-s);
else
luaL_error(ms->L,"invalid capture index");
}
else{
ptrdiff_t l=ms->capture[i].len;
if(l==(-1))luaL_error(ms->L,"unfinished capture");
if(l==(-2))
lua_pushinteger(ms->L,ms->capture[i].init-ms->src_init+1);
else
lua_pushlstring(ms->L,ms->capture[i].init,l);
}
}